

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void worker(void *arg)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uv__queue *puVar4;
  uv__queue **ppuVar5;
  bool bVar6;
  uv__queue *puStack_20;
  int is_slow_work;
  uv__queue *q;
  uv__work *w;
  void *arg_local;
  
  uv_sem_post((uv_sem_t *)arg);
  uv_mutex_lock(&mutex);
LAB_0012fffb:
  do {
    while( true ) {
      while( true ) {
        iVar2 = uv__queue_empty(&wq);
        bVar6 = true;
        if (iVar2 == 0) {
          puVar4 = uv__queue_head(&wq);
          bVar6 = false;
          if (puVar4 == &run_slow_work_message) {
            puVar4 = uv__queue_next(&run_slow_work_message);
            uVar1 = slow_io_work_running;
            bVar6 = false;
            if (puVar4 == &wq) {
              uVar3 = slow_work_thread_threshold();
              bVar6 = uVar3 <= uVar1;
            }
          }
        }
        if (!bVar6) break;
        idle_threads = idle_threads + 1;
        uv_cond_wait(&cond,&mutex);
        idle_threads = idle_threads - 1;
      }
      puStack_20 = uv__queue_head(&wq);
      if (puStack_20 == &exit_message) {
        uv_cond_signal(&cond);
        uv_mutex_unlock(&mutex);
        return;
      }
      uv__queue_remove(puStack_20);
      uv__queue_init(puStack_20);
      uVar1 = slow_io_work_running;
      bVar6 = false;
      if (puStack_20 == &run_slow_work_message) break;
LAB_001301ce:
      uv_mutex_unlock(&mutex);
      ppuVar5 = &puStack_20[-2].prev;
      (*(code *)*ppuVar5)(ppuVar5);
      uv_mutex_lock((uv_mutex_t *)&puStack_20[-1].prev[8].prev);
      *ppuVar5 = (uv__queue *)0x0;
      uv__queue_insert_tail((uv__queue *)&puStack_20[-1].prev[7].prev,puStack_20);
      uv_async_send((uv_async_t *)(puStack_20[-1].prev + 0xb));
      uv_mutex_unlock((uv_mutex_t *)&puStack_20[-1].prev[8].prev);
      uv_mutex_lock(&mutex);
      if (bVar6) {
        slow_io_work_running = slow_io_work_running - 1;
      }
    }
    uVar3 = slow_work_thread_threshold();
    if (uVar1 < uVar3) {
      iVar2 = uv__queue_empty(&slow_io_pending_wq);
      if (iVar2 == 0) {
        bVar6 = true;
        slow_io_work_running = slow_io_work_running + 1;
        puStack_20 = uv__queue_head(&slow_io_pending_wq);
        uv__queue_remove(puStack_20);
        uv__queue_init(puStack_20);
        iVar2 = uv__queue_empty(&slow_io_pending_wq);
        if ((iVar2 == 0) && (uv__queue_insert_tail(&wq,&run_slow_work_message), idle_threads != 0))
        {
          uv_cond_signal(&cond);
        }
        goto LAB_001301ce;
      }
      goto LAB_0012fffb;
    }
    uv__queue_insert_tail(&wq,&run_slow_work_message);
  } while( true );
}

Assistant:

static void worker(void* arg) {
  struct uv__work* w;
  struct uv__queue* q;
  int is_slow_work;

  uv_sem_post((uv_sem_t*) arg);
  arg = NULL;

  uv_mutex_lock(&mutex);
  for (;;) {
    /* `mutex` should always be locked at this point. */

    /* Keep waiting while either no work is present or only slow I/O
       and we're at the threshold for that. */
    while (uv__queue_empty(&wq) ||
           (uv__queue_head(&wq) == &run_slow_work_message &&
            uv__queue_next(&run_slow_work_message) == &wq &&
            slow_io_work_running >= slow_work_thread_threshold())) {
      idle_threads += 1;
      uv_cond_wait(&cond, &mutex);
      idle_threads -= 1;
    }

    q = uv__queue_head(&wq);
    if (q == &exit_message) {
      uv_cond_signal(&cond);
      uv_mutex_unlock(&mutex);
      break;
    }

    uv__queue_remove(q);
    uv__queue_init(q);  /* Signal uv_cancel() that the work req is executing. */

    is_slow_work = 0;
    if (q == &run_slow_work_message) {
      /* If we're at the slow I/O threshold, re-schedule until after all
         other work in the queue is done. */
      if (slow_io_work_running >= slow_work_thread_threshold()) {
        uv__queue_insert_tail(&wq, q);
        continue;
      }

      /* If we encountered a request to run slow I/O work but there is none
         to run, that means it's cancelled => Start over. */
      if (uv__queue_empty(&slow_io_pending_wq))
        continue;

      is_slow_work = 1;
      slow_io_work_running++;

      q = uv__queue_head(&slow_io_pending_wq);
      uv__queue_remove(q);
      uv__queue_init(q);

      /* If there is more slow I/O work, schedule it to be run as well. */
      if (!uv__queue_empty(&slow_io_pending_wq)) {
        uv__queue_insert_tail(&wq, &run_slow_work_message);
        if (idle_threads > 0)
          uv_cond_signal(&cond);
      }
    }

    uv_mutex_unlock(&mutex);

    w = uv__queue_data(q, struct uv__work, wq);
    w->work(w);

    uv_mutex_lock(&w->loop->wq_mutex);
    w->work = NULL;  /* Signal uv_cancel() that the work req is done
                        executing. */
    uv__queue_insert_tail(&w->loop->wq, &w->wq);
    uv_async_send(&w->loop->wq_async);
    uv_mutex_unlock(&w->loop->wq_mutex);

    /* Lock `mutex` since that is expected at the start of the next
     * iteration. */
    uv_mutex_lock(&mutex);
    if (is_slow_work) {
      /* `slow_io_work_running` is protected by `mutex`. */
      slow_io_work_running--;
    }
  }
}